

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void autoIncrementEnd(Parse *pParse)

{
  int iVar1;
  int p3;
  Vdbe *p_00;
  sqlite3 *psVar2;
  Db *pDVar3;
  int iReg;
  int iVar4;
  VdbeOp *pVVar5;
  int memId;
  int iRec;
  Db *pDb;
  VdbeOp *aOp;
  sqlite3 *db;
  Vdbe *v;
  AutoincInfo *p;
  Parse *pParse_local;
  
  p_00 = pParse->pVdbe;
  psVar2 = pParse->db;
  v = (Vdbe *)pParse->pAinc;
  while( true ) {
    if (v == (Vdbe *)0x0) {
      return;
    }
    pDVar3 = psVar2->aDb;
    iVar1 = *(int *)&v->pVNext;
    p3 = *(int *)((long)&v->pVNext + 4);
    iReg = sqlite3GetTempReg(pParse);
    iVar4 = sqlite3VdbeCurrentAddr(p_00);
    sqlite3VdbeAddOp3(p_00,0x37,p3 + 2,iVar4 + 7,p3);
    sqlite3OpenTable(pParse,0,*(int *)&v->pVNext,(pDVar3[iVar1].pSchema)->pSeqTab,0x71);
    pVVar5 = sqlite3VdbeAddOpList(p_00,5,autoIncrementEnd::autoIncEnd,0);
    if (pVVar5 == (VdbeOp *)0x0) break;
    pVVar5->p1 = p3 + 1;
    pVVar5[1].p2 = p3 + 1;
    pVVar5[2].p1 = p3 + -1;
    pVVar5[2].p3 = iReg;
    pVVar5[3].p2 = iReg;
    pVVar5[3].p3 = p3 + 1;
    pVVar5[3].p5 = 8;
    sqlite3ReleaseTempReg(pParse,iReg);
    v = (Vdbe *)v->db;
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void autoIncrementEnd(Parse *pParse){
  AutoincInfo *p;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( v );
  for(p = pParse->pAinc; p; p = p->pNext){
    static const int iLn = VDBE_OFFSET_LINENO(2);
    static const VdbeOpList autoIncEnd[] = {
      /* 0 */ {OP_NotNull,     0, 2, 0},
      /* 1 */ {OP_NewRowid,    0, 0, 0},
      /* 2 */ {OP_MakeRecord,  0, 2, 0},
      /* 3 */ {OP_Insert,      0, 0, 0},
      /* 4 */ {OP_Close,       0, 0, 0}
    };
    VdbeOp *aOp;
    Db *pDb = &db->aDb[p->iDb];
    int iRec;
    int memId = p->regCtr;

    iRec = sqlite3GetTempReg(pParse);
    assert( sqlite3SchemaMutexHeld(db, 0, pDb->pSchema) );
    sqlite3VdbeAddOp3(v, OP_Le, memId+2, sqlite3VdbeCurrentAddr(v)+7, memId);
    VdbeCoverage(v);
    sqlite3OpenTable(pParse, 0, p->iDb, pDb->pSchema->pSeqTab, OP_OpenWrite);
    aOp = sqlite3VdbeAddOpList(v, ArraySize(autoIncEnd), autoIncEnd, iLn);
    if( aOp==0 ) break;
    aOp[0].p1 = memId+1;
    aOp[1].p2 = memId+1;
    aOp[2].p1 = memId-1;
    aOp[2].p3 = iRec;
    aOp[3].p2 = iRec;
    aOp[3].p3 = memId+1;
    aOp[3].p5 = OPFLAG_APPEND;
    sqlite3ReleaseTempReg(pParse, iRec);
  }
}